

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PigLatinTranslator.cpp
# Opt level: O0

string * to_lower_case(string *str)

{
  bool bVar1;
  char cVar2;
  reference pcVar3;
  string *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator letter;
  string *str_local;
  
  local_20._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_28._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pcVar3 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_20);
    bVar1 = is_upper_case(*pcVar3);
    if (bVar1) {
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      cVar2 = to_lower_case(*pcVar3);
      pcVar3 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_20);
      *pcVar3 = cVar2;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_20,0);
  }
  std::__cxx11::string::string((string *)str,in_RSI);
  return str;
}

Assistant:

std::string to_lower_case(std::string str) {
  for(std::string::iterator letter = str.begin(); letter != str.end(); letter++) {
    if(is_upper_case(*letter)) {
      *letter = to_lower_case(*letter);
    }
  }
  return str;
}